

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::anon_unknown_1::InvarianceTest::init
          (InvarianceTest *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  undefined4 *puVar4;
  ostringstream *this_00;
  RenderContext *pRVar5;
  InvarianceTest *pIVar6;
  int i;
  int iVar7;
  deUint32 err;
  int extraout_EAX;
  RenderTarget *pRVar8;
  ShaderProgram *pSVar9;
  TestLog *pTVar10;
  void *__s;
  undefined4 extraout_var;
  long lVar11;
  NotSupportedError *this_01;
  long *plVar12;
  TestError *pTVar13;
  long lVar14;
  Vec4 VVar15;
  Vec4 vertex3;
  Vector<float,_4> res;
  ShaderPair vertexShaders;
  Random rnd;
  Vec4 vertex1;
  undefined1 local_438 [16];
  char local_428 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  long local_408;
  InvarianceTest *local_400;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  long *local_3b0;
  long local_3a8;
  long local_3a0 [2];
  long *local_390;
  long local_388;
  long local_380 [2];
  long *local_370;
  long local_368;
  long local_360 [2];
  string local_350;
  undefined1 local_330 [120];
  ios_base local_2b8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2a0;
  undefined1 local_280 [208];
  undefined1 local_1b0 [8];
  undefined1 auStack_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_198 [6];
  ios_base local_138 [264];
  
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderSize <= pRVar8->m_width) {
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_renderSize <= pRVar8->m_height) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_3d0);
      pSVar9 = (ShaderProgram *)operator_new(0xd0);
      pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
      local_280[0x10] = 0;
      local_280._17_8_ = 0;
      local_280._0_8_ = (pointer)0x0;
      local_280[8] = 0;
      local_280._9_7_ = 0;
      memset(local_330,0,0xac);
      local_1b0 = (undefined1  [8])((ulong)(uint)local_1b0._4_4_ << 0x20);
      auStack_1a8._0_8_ = aaStack_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_1a8,local_3d0._M_dataplus._M_p,
                 local_3d0._M_dataplus._M_p + local_3d0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + ((ulong)local_1b0 & 0xffffffff) * 0x18),(value_type *)auStack_1a8)
      ;
      local_438._0_4_ = 1;
      local_438._8_8_ = &local_420;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_438 + 8),local_3b0,local_3a8 + (long)local_3b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + (local_438._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_438 + 8));
      glu::ShaderProgram::ShaderProgram(pSVar9,pRVar5,(ProgramSources *)local_330);
      this->m_shader0 = pSVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._8_8_ != &local_420) {
        operator_delete((void *)local_438._8_8_,local_420._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_1a8._0_8_ != aaStack_198) {
        operator_delete((void *)auStack_1a8._0_8_,aaStack_198[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_2a0);
      lVar14 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + lVar14));
        lVar14 = lVar14 + -0x18;
      } while (lVar14 != -0x18);
      if ((this->m_shader0->m_program).m_info.linkOk == false) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        this->m_shader0);
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        local_330._0_8_ = local_330 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_330,"Test shader compile failed.","");
        tcu::TestError::TestError(pTVar13,(string *)local_330);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pSVar9 = (ShaderProgram *)operator_new(0xd0);
      pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
      local_280[0x10] = 0;
      local_280._17_8_ = 0;
      local_280._0_8_ = (pointer)0x0;
      local_280[8] = 0;
      local_280._9_7_ = 0;
      memset(local_330,0,0xac);
      local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffff00000000);
      auStack_1a8._0_8_ = aaStack_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_1a8,local_390,local_388 + (long)local_390);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + ((ulong)local_1b0 & 0xffffffff) * 0x18),(value_type *)auStack_1a8)
      ;
      local_438._0_4_ = 1;
      local_438._8_8_ = &local_420;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_438 + 8),local_370,local_368 + (long)local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + (local_438._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_438 + 8));
      glu::ShaderProgram::ShaderProgram(pSVar9,pRVar5,(ProgramSources *)local_330);
      this->m_shader1 = pSVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._8_8_ != &local_420) {
        operator_delete((void *)local_438._8_8_,local_420._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_1a8._0_8_ != aaStack_198) {
        operator_delete((void *)auStack_1a8._0_8_,aaStack_198[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_2a0);
      lVar14 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_330 + lVar14));
        lVar14 = lVar14 + -0x18;
      } while (lVar14 != -0x18);
      if ((this->m_shader1->m_program).m_info.linkOk != false) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"Shader 1:",9);
        pTVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
        local_330._0_8_ = glu::operator<<(pTVar10,this->m_shader0);
        this_00 = (ostringstream *)(local_330 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Shader 2:",9);
        pTVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
        glu::operator<<(pTVar10,this->m_shader1);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_370 != local_360) {
          operator_delete(local_370,local_360[0] + 1);
        }
        if (local_390 != local_380) {
          operator_delete(local_390,local_380[0] + 1);
        }
        if (local_3b0 != local_3a0) {
          operator_delete(local_3b0,local_3a0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        deRandom_init((deRandom *)local_330,0x7b);
        __s = operator_new(0x1b00);
        memset(__s,0,0x1b00);
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        local_408 = CONCAT44(extraout_var,iVar7);
        lVar14 = 0;
        local_400 = this;
        do {
          genRandomVector((anon_unknown_1 *)local_1b0,(Random *)local_330);
          genRandomVector((anon_unknown_1 *)&local_3d0,(Random *)local_330);
          genRandomVector((anon_unknown_1 *)&local_350,(Random *)local_330);
          pIVar6 = local_400;
          local_3f8._M_dataplus._M_p = (pointer)0x0;
          local_3f8._M_string_length = 0;
          lVar11 = 0;
          do {
            *(float *)((long)&local_3f8._M_dataplus._M_p + lVar11 * 4) =
                 *(float *)((long)&local_350._M_dataplus._M_p + lVar11 * 4) * 0.01;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_438._0_8_ = (pointer)0x0;
          local_438._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          lVar11 = 0;
          do {
            *(float *)(local_438 + lVar11 * 4) =
                 *(float *)((long)&local_3d0._M_dataplus._M_p + lVar11 * 4) +
                 *(float *)((long)&local_3f8._M_dataplus._M_p + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          lVar11 = lVar14 * 0x30;
          *(undefined8 *)((long)__s + lVar11) = local_1b0;
          ((undefined8 *)((long)__s + lVar11))[1] = auStack_1a8._0_8_;
          puVar2 = (undefined8 *)((long)__s + lVar11 + 0x10);
          *puVar2 = local_3d0._M_dataplus._M_p;
          puVar2[1] = local_3d0._M_string_length;
          puVar3 = (ulong *)((long)__s + lVar11 + 0x20);
          *puVar3 = local_438._0_8_;
          puVar3[1] = local_438._8_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x48);
        lVar14 = 0xda0;
        do {
          genRandomVector((anon_unknown_1 *)local_1b0,(Random *)local_330);
          puVar2 = (undefined8 *)((long)__s + lVar14 + -0x20);
          *puVar2 = local_1b0;
          puVar2[1] = auStack_1a8._0_8_;
          genRandomVector((anon_unknown_1 *)local_1b0,(Random *)local_330);
          puVar2 = (undefined8 *)((long)__s + lVar14 + -0x10);
          *puVar2 = local_1b0;
          puVar2[1] = auStack_1a8._0_8_;
          VVar15 = genRandomVector((anon_unknown_1 *)local_1b0,(Random *)local_330);
          lVar11 = local_408;
          puVar4 = (undefined4 *)((long)__s + lVar14);
          *puVar4 = local_1b0._0_4_;
          puVar4[1] = local_1b0._4_4_;
          puVar4[2] = auStack_1a8._0_4_;
          puVar4[3] = auStack_1a8._4_4_;
          lVar14 = lVar14 + 0x30;
        } while (lVar14 != 0x1b20);
        pGVar1 = &pIVar6->m_arrayBuf;
        (**(code **)(local_408 + 0x6c8))(local_1b0._0_4_,VVar15.m_data._8_8_,1,pGVar1);
        (**(code **)(lVar11 + 0x40))(0x8892,*pGVar1);
        (**(code **)(lVar11 + 0x150))(0x8892,0x1b00,__s,0x88e4);
        err = (**(code **)(lVar11 + 0x800))();
        glu::checkError(err,"buffer gen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderInvarianceTests.cpp"
                        ,0xeb);
        pIVar6->m_verticesInPattern = 0xd8;
        operator_delete(__s,0x1b00);
        return extraout_EAX;
      }
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      this->m_shader1);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      local_330._0_8_ = local_330 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_330,"Test shader compile failed.","");
      tcu::TestError::TestError(pTVar13,(string *)local_330);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_438._0_8_ = local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,"Render target size must be at least ","");
  de::toString<int>(&local_3f8,&this->m_renderSize);
  std::operator+(&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 &local_3f8);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_1b0 = (undefined1  [8])*plVar12;
  pTVar10 = (TestLog *)(plVar12 + 2);
  if (local_1b0 == (undefined1  [8])pTVar10) {
    auStack_1a8._8_8_ = pTVar10->m_log;
    aaStack_198[0]._0_8_ = plVar12[3];
    local_1b0 = (undefined1  [8])(auStack_1a8 + 8);
  }
  else {
    auStack_1a8._8_8_ = pTVar10->m_log;
  }
  auStack_1a8._0_8_ = plVar12[1];
  *plVar12 = (long)pTVar10;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  de::toString<int>(&local_350,&this->m_renderSize);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_350);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_330);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InvarianceTest::init (void)
{
	// Invariance tests require drawing to the screen and reading back results.
	// Tests results are not reliable if the resolution is too small
	{
		if (m_context.getRenderTarget().getWidth()  < m_renderSize ||
			m_context.getRenderTarget().getHeight() < m_renderSize)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));
	}

	// Gen shaders
	{
		ShaderPair vertexShaders = genShaders();

		m_shader0 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource0) << glu::FragmentSource(vertexShaders.fragmentShaderSource0));
		if (!m_shader0->isOk())
		{
			m_testCtx.getLog() << *m_shader0;
			throw tcu::TestError("Test shader compile failed.");
		}

		m_shader1 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource1) << glu::FragmentSource(vertexShaders.fragmentShaderSource1));
		if (!m_shader1->isOk())
		{
			m_testCtx.getLog() << *m_shader1;
			throw tcu::TestError("Test shader compile failed.");
		}

		// log
		m_testCtx.getLog()
			<< tcu::TestLog::Message << "Shader 1:" << tcu::TestLog::EndMessage
			<< *m_shader0
			<< tcu::TestLog::Message << "Shader 2:" << tcu::TestLog::EndMessage
			<< *m_shader1;
	}

	// Gen test pattern
	{
		const int				numTriangles	= 72;
		de::Random				rnd				(123);
		std::vector<tcu::Vec4>	triangles		(numTriangles * 3 * 2);
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

		// Narrow triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			const tcu::Vec4 vertex1 = genRandomVector(rnd);
			const tcu::Vec4 vertex2 = genRandomVector(rnd);
			const tcu::Vec4 vertex3 = vertex2 + genRandomVector(rnd) * 0.01f; // generate narrow triangles

			triangles[triNdx*3 + 0] = vertex1;
			triangles[triNdx*3 + 1] = vertex2;
			triangles[triNdx*3 + 2] = vertex3;
		}

		// Normal triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			triangles[(numTriangles + triNdx)*3 + 0] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 1] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 2] = genRandomVector(rnd);
		}

		// upload
		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(triangles.size() * sizeof(tcu::Vec4)), &triangles[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

		m_verticesInPattern = numTriangles * 3;
	}
}